

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O1

vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *
dgrminer::find_backward_edge_candidates
          (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
           *__return_storage_ptr__,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *adj_list,
          vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
          *adj_more_info,int src,int dst,vector<int,_std::allocator<int>_> *real_ids_src,
          vector<int,_std::allocator<int>_> *real_ids_dst,
          vector<int,_std::allocator<int>_> *real_ids_dst_ind)

{
  _Rb_tree_header *p_Var1;
  pointer pvVar2;
  _Base_ptr p_Var3;
  long lVar4;
  iterator __position;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  uint uVar9;
  pointer piVar10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  array<int,_8UL> *paVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  set<int,_std::less<int>,_std::allocator<int>_> occupied_from_the_same_direction;
  array<int,_8UL> *local_c8;
  iterator iStack_c0;
  array<int,_8UL> *local_b8;
  vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *local_a8;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  *local_a0;
  long local_98;
  int local_8c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_88;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_80;
  array<int,_8UL> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar10 = (real_ids_src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_a8 = (vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *)
             __return_storage_ptr__;
  local_a0 = adj_more_info;
  local_88 = adj_list;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((real_ids_src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar10) {
    lVar15 = 0;
    uVar16 = 0;
    do {
      if ((piVar10[uVar16] == src) &&
         ((real_ids_dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar16] == dst)) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_80,
                   (int *)((long)(real_ids_dst_ind->super__Vector_base<int,_std::allocator<int>_>).
                                 _M_impl.super__Vector_impl_data._M_start + lVar15));
      }
      uVar16 = uVar16 + 1;
      piVar10 = (real_ids_src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 4;
    } while (uVar16 < (ulong)((long)(real_ids_src->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2))
    ;
  }
  local_c8 = (array<int,_8UL> *)0x0;
  iStack_c0._M_current = (array<int,_8UL> *)0x0;
  local_b8 = (array<int,_8UL> *)0x0;
  piVar10 = (real_ids_src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((real_ids_src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar10) {
    uVar16 = 0;
    do {
      if ((piVar10[uVar16] == dst) &&
         ((real_ids_dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar16] == src)) {
        paVar13 = (array<int,_8UL> *)
                  ((long)(real_ids_dst_ind->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar16] * 0x20 +
                  *(long *)&(local_a0->
                            super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[dst].
                            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                            ._M_impl.super__Vector_impl_data);
        if (iStack_c0._M_current == local_b8) {
          std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
          _M_realloc_insert<std::array<int,8ul>const&>
                    ((vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *)&local_c8,
                     iStack_c0,paVar13);
        }
        else {
          uVar5 = *(undefined8 *)paVar13->_M_elems;
          uVar6 = *(undefined8 *)(paVar13->_M_elems + 2);
          uVar7 = *(undefined8 *)(paVar13->_M_elems + 6);
          *(undefined8 *)((iStack_c0._M_current)->_M_elems + 4) =
               *(undefined8 *)(paVar13->_M_elems + 4);
          *(undefined8 *)((iStack_c0._M_current)->_M_elems + 6) = uVar7;
          *(undefined8 *)(iStack_c0._M_current)->_M_elems = uVar5;
          *(undefined8 *)((iStack_c0._M_current)->_M_elems + 2) = uVar6;
          iStack_c0._M_current = iStack_c0._M_current + 1;
        }
      }
      uVar16 = uVar16 + 1;
      piVar10 = (real_ids_src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(real_ids_src->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2))
    ;
  }
  lVar15 = (long)src;
  pvVar2 = (local_88->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_98 = lVar15 * 3;
  uVar9 = (int)((ulong)((long)*(pointer *)
                               ((long)&pvVar2[lVar15].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data + 8) -
                       *(long *)&pvVar2[lVar15].super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data) >> 2) - 1;
  if (-1 < (int)uVar9) {
    uVar16 = (ulong)uVar9;
    local_8c = dst;
    do {
      if (*(int *)(*(long *)((long)&(((local_88->
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data + local_98 * 8) + uVar16 * 4) ==
          local_8c) {
        p_Var1 = &local_80._M_impl.super__Rb_tree_header;
        p_Var11 = &p_Var1->_M_header;
        for (p_Var3 = local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
            p_Var3 = (&p_Var3->_M_left)[(long)(int)*(size_t *)(p_Var3 + 1) < (long)uVar16]) {
          if ((long)uVar16 <= (long)(int)*(size_t *)(p_Var3 + 1)) {
            p_Var11 = p_Var3;
          }
        }
        p_Var12 = p_Var1;
        if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
           (p_Var12 = (_Rb_tree_header *)p_Var11,
           (long)uVar16 < (long)(int)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
          p_Var12 = p_Var1;
        }
        if (p_Var12 == p_Var1) {
          if (iStack_c0._M_current != local_c8) {
            lVar15 = 0;
            uVar14 = 0;
            do {
              lVar4 = *(long *)((long)&(((local_a0->
                                         super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                       )._M_impl.super__Vector_impl_data + local_98 * 8);
              flipAdjacencyInfo((array<int,_8UL> *)((long)local_c8->_M_elems + lVar15));
              bVar8 = is_adj_info_equal_to
                                ((array<int,_8UL> *)(lVar4 + uVar16 * 0x20),&local_50,false);
              if (bVar8) goto LAB_00110679;
              uVar14 = uVar14 + 1;
              lVar15 = lVar15 + 0x20;
            } while (uVar14 < (ulong)((long)iStack_c0._M_current - (long)local_c8 >> 5));
          }
          paVar13 = (array<int,_8UL> *)
                    (uVar16 * 0x20 +
                    *(long *)((long)&(((local_a0->
                                       super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                     )._M_impl.super__Vector_impl_data + local_98 * 8));
          __position._M_current = *(array<int,_8UL> **)(local_a8 + 8);
          if (__position._M_current == *(array<int,_8UL> **)(local_a8 + 0x10)) {
            std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
            _M_realloc_insert<std::array<int,8ul>const&>(local_a8,__position,paVar13);
          }
          else {
            uVar5 = *(undefined8 *)paVar13->_M_elems;
            uVar6 = *(undefined8 *)(paVar13->_M_elems + 2);
            uVar7 = *(undefined8 *)(paVar13->_M_elems + 6);
            *(undefined8 *)((__position._M_current)->_M_elems + 4) =
                 *(undefined8 *)(paVar13->_M_elems + 4);
            *(undefined8 *)((__position._M_current)->_M_elems + 6) = uVar7;
            *(undefined8 *)(__position._M_current)->_M_elems = uVar5;
            *(undefined8 *)((__position._M_current)->_M_elems + 2) = uVar6;
            *(array<int,_8UL> **)(local_a8 + 8) = __position._M_current + 1;
          }
        }
      }
LAB_00110679:
      bVar8 = 0 < (long)uVar16;
      uVar16 = uVar16 - 1;
    } while (bVar8);
  }
  if (local_c8 != (array<int,_8UL> *)0x0) {
    operator_delete(local_c8);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_80);
  return (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_a8;
}

Assistant:

std::vector<std::array<int, 8>> find_backward_edge_candidates(std::vector<std::vector<int>> &adj_list,
		std::vector<std::vector<std::array<int, 8>>> &adj_more_info, int src, int dst,
		std::vector<int> &real_ids_src, std::vector<int> &real_ids_dst, std::vector<int> &real_ids_dst_ind)
	{
		std::vector<std::array<int, 8>> edge_candidates;

		std::set<int> occupied_from_the_same_direction;
		for (size_t i = 0; i < real_ids_src.size(); i++)
		{
			if (real_ids_src[i] == src && real_ids_dst[i] == dst) {
				occupied_from_the_same_direction.insert(real_ids_dst_ind[i]);
			}
		}
		std::vector<std::array<int, 8>> occupied_edges_from_other_direction;
		for (size_t i = 0; i < real_ids_src.size(); i++)
		{
			if (real_ids_src[i] == dst && real_ids_dst[i] == src) {
				occupied_edges_from_other_direction.push_back(adj_more_info[dst][real_ids_dst_ind[i]]);
			}
		}

		// do it in a reversed order, so we can find dummy first - this property is used in the .enumerate function
		for (int v = adj_list[src].size() - 1; v >= 0; v--)
		{
			//if it is the appropriate edge and it can be taken (if it is not occupied from the same direction):
			if (adj_list[src][v] == dst && occupied_from_the_same_direction.count(v) == 0)
			{
				bool can_be_used = true;
				for (size_t i = 0; i < occupied_edges_from_other_direction.size(); i++)
				{
					if (is_adj_info_equal_to(adj_more_info[src][v], flipAdjacencyInfo(occupied_edges_from_other_direction[i]), false))
					{
						can_be_used = false;
						break;
					}
				}
				if (can_be_used)
				{
					edge_candidates.push_back(adj_more_info[src][v]);
				}
			}
		}
		return edge_candidates;
	}